

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon.c
# Opt level: O3

_Bool borg_think_dungeon_brave(void)

{
  _Bool _Var1;
  wchar_t p1;
  char cVar2;
  char *pcVar3;
  
  p1 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
  if ((borg.trait[0x69] == 100) && (_Var1 = borg_defend(p1), _Var1)) {
    return true;
  }
  _Var1 = borg_attack(true);
  if (_Var1) {
    return true;
  }
  _Var1 = borg_light_beam(false);
  if (_Var1) {
    return true;
  }
  if (borg_grids[borg.c.y][borg.c.x].feat == '\x06') {
    borg_note("# Fleeing via stairs.");
    borg_keypress(0x3e);
    return true;
  }
  if (borg.goal.less == true) {
    _Var1 = borg_flow_old(L'\a');
    if (_Var1) {
      return true;
    }
    if (((scaryguy_on_level == true) && (borg.trait[0x69] == 0)) &&
       (_Var1 = borg_flow_stair_both(7,false), _Var1)) {
      return true;
    }
    _Var1 = borg_flow_stair_less(7,false);
    if (_Var1) {
      pcVar3 = "# Looking for stairs. Goal_less, brave.";
      goto LAB_00248d32;
    }
  }
  if (((borg.goal.fleeing != false) || (borg.goal.leaving != false)) || (scaryguy_on_level == true))
  {
    cVar2 = '\x01';
    if (borg.ready_morgoth != L'\0') {
      cVar2 = borg.goal.fleeing;
    }
    borg.stair_less = (_Bool)'\0';
    if ((player->opts).opt[0x20] == false) {
      borg.stair_less = (_Bool)cVar2;
    }
    if (borg.stair_less == true) {
      borg_note("# Fleeing and leaving the level. Brave Thinking.");
    }
    borg.stair_more = borg.goal.fleeing;
    pcVar3 = borg_prepared(borg.trait[0x69] + L'\x01');
    if (pcVar3 == (char *)0x0) {
      borg.stair_more = true;
    }
    _Var1 = borg_flow_old(L'\a');
    if (_Var1) {
      return true;
    }
    if ((borg.stair_less == true) && (_Var1 = borg_flow_stair_less(7,false), _Var1)) {
      pcVar3 = "# Looking for stairs. Flee, brave.";
LAB_00248d32:
      borg_note(pcVar3);
      return true;
    }
    if ((borg.stair_more == true) && (_Var1 = borg_flow_stair_more(7,false,true), _Var1)) {
      return true;
    }
  }
  if (vault_on_level == true) {
    _Var1 = borg_flow_old(L'\x01');
    if (_Var1) {
      return true;
    }
    _Var1 = borg_flow_kill(true,L'#');
    if (_Var1) {
      return true;
    }
    _Var1 = borg_flow_old(L'\x02');
    if (_Var1) {
      return true;
    }
    _Var1 = borg_flow_take(true,L'#');
    if (_Var1) {
      return true;
    }
    _Var1 = borg_flow_vein(true,L'#');
    if (_Var1) {
      return true;
    }
    _Var1 = borg_flow_old(L'\b');
    if (_Var1) {
      return true;
    }
    _Var1 = borg_flow_vault(L'#');
    if (_Var1) {
      return true;
    }
  }
  _Var1 = borg_flow_old(L'\x01');
  if (((((((!_Var1) && (_Var1 = borg_flow_kill(true,L'ú'), !_Var1)) &&
         (_Var1 = borg_flow_old(L'\x02'), !_Var1)) &&
        ((_Var1 = borg_flow_take(true,L'ú'), !_Var1 && (_Var1 = borg_flow_vein(true,L'ú'), !_Var1)
         ))) && ((_Var1 = borg_flow_old(L'\x03'), !_Var1 &&
                 ((_Var1 = borg_flow_old(L'\x04'), !_Var1 &&
                  (_Var1 = borg_flow_old(L'\x05'), !_Var1)))))) &&
      (_Var1 = borg_flow_old(L'\x06'), !_Var1)) &&
     ((_Var1 = borg_flow_dark(true), !_Var1 && (_Var1 = borg_flow_dark(false), !_Var1)))) {
    if (((borg.when_detect_doors == 0) || (499 < (int)borg_t - (int)borg.when_detect_doors)) &&
       (_Var1 = borg_check_light(), _Var1)) {
      return true;
    }
    _Var1 = borg_flow_take(false,L'ú');
    if (((!_Var1) && (_Var1 = borg_flow_vein(false,L'ú'), !_Var1)) &&
       (_Var1 = borg_flow_kill(false,L'ú'), !_Var1)) {
      if (((borg.when_detect_doors == 0) || (499 < (int)borg_t - (int)borg.when_detect_doors)) &&
         (_Var1 = borg_check_light(), _Var1)) {
        return true;
      }
      _Var1 = borg_leave_level(true);
      if (!_Var1) {
        _Var1 = borg_flow_spastic(true);
        return _Var1;
      }
    }
  }
  return true;
}

Assistant:

static bool borg_think_dungeon_brave(void)
{
    /*** Local stuff ***/
    int p1 = borg_danger(borg.c.y, borg.c.x, 1, true, false);

    /* Try a defense maneuver on 100 */
    if (borg.trait[BI_CDEPTH] == 100 && borg_defend(p1))
        return true;

    /* Attack monsters */
    if (borg_attack(true))
        return true;

    /* Cast a light beam to remove fear of an area */
    if (borg_light_beam(false))
        return true;

    /*** Flee (or leave) the level ***/

    /* Take stairs down */
    /* Usable stairs */
    if (borg_grids[borg.c.y][borg.c.x].feat == FEAT_MORE) {
        /* Take the stairs */
        borg_note("# Fleeing via stairs.");
        borg_keypress('>');

        /* Success */
        return true;
    }

    /* Return to Stairs, but not use them */
    if (borg.goal.less) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Try to find some stairs */
        if (scaryguy_on_level && !borg.trait[BI_CDEPTH]
            && borg_flow_stair_both(GOAL_FLEE, false))
            return true;

        /* Try to find some stairs up */
        if (borg_flow_stair_less(GOAL_FLEE, false)) {
            borg_note("# Looking for stairs. Goal_less, brave.");
            return true;
        }
    }

    /* Flee the level */
    if (borg.goal.fleeing || borg.goal.leaving || scaryguy_on_level) {
        /* Hack -- Take the next stairs */
        borg.stair_less = borg.goal.fleeing;

        if (borg.ready_morgoth == 0)
            borg.stair_less = true;

        if (OPT(player, birth_force_descend))
            borg.stair_less = false;

        if (borg.stair_less == true) {
            borg_note("# Fleeing and leaving the level. Brave Thinking.");
        }

        /* Go down if fleeing or prepared. */
        borg.stair_more = borg.goal.fleeing;
        if ((char *)NULL == borg_prepared(borg.trait[BI_CDEPTH] + 1))
            borg.stair_more = true;

        /* Continue fleeing the level */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Try to find some stairs up */
        if (borg.stair_less)
            if (borg_flow_stair_less(GOAL_FLEE, false)) {
                borg_note("# Looking for stairs. Flee, brave.");
                return true;
            }

        /* Try to find some stairs down */
        if (borg.stair_more)
            if (borg_flow_stair_more(GOAL_FLEE, false, true))
                return true;
    }

    /* Do short looks on special levels */
    if (vault_on_level) {
        /* Continue flowing towards monsters */
        if (borg_flow_old(GOAL_KILL))
            return true;

        /* Find a (viewable) monster */
        if (borg_flow_kill(true, 35))
            return true;

        /* Continue flowing towards objects */
        if (borg_flow_old(GOAL_TAKE))
            return true;

        /* Find a (viewable) object */
        if (borg_flow_take(true, 35))
            return true;
        if (borg_flow_vein(true, 35))
            return true;

        /* Continue to dig out a vault */
        if (borg_flow_old(GOAL_VAULT))
            return true;

        /* Find a vault to excavate */
        if (borg_flow_vault(35))
            return true;
    }

    /* Continue flowing towards monsters */
    if (borg_flow_old(GOAL_KILL))
        return true;

    /* Find a (viewable) monster */
    if (borg_flow_kill(true, 250))
        return true;

    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Find a (viewable) object */
    if (borg_flow_take(true, 250))
        return true;
    if (borg_flow_vein(true, 250))
        return true;

    /*** Exploration ***/

    /* Continue flowing (see below) */
    if (borg_flow_old(GOAL_MISC))
        return true;

    /* Continue flowing (see below) */
    if (borg_flow_old(GOAL_DARK))
        return true;

    /* Continue flowing (see below) */
    if (borg_flow_old(GOAL_XTRA))
        return true;

    /* Continue flowing (see below) */
    if (borg_flow_old(GOAL_BORE))
        return true;

    /*** Explore the dungeon ***/

    /* Explore interesting grids */
    if (borg_flow_dark(true))
        return true;

    /* Explore interesting grids */
    if (borg_flow_dark(false))
        return true;

    /* Search for secret door via spell before spastic */
    if (!borg.when_detect_doors || (borg_t - borg.when_detect_doors >= 500)) {
        if (borg_check_light())
            return true;
    }

    /*** Track down old stuff ***/

    /* Chase old objects */
    if (borg_flow_take(false, 250))
        return true;
    if (borg_flow_vein(false, 250))
        return true;

    /* Chase old monsters */
    if (borg_flow_kill(false, 250))
        return true;

    /* Search for secret door via spell before spastic */
    if (!borg.when_detect_doors || (borg_t - borg.when_detect_doors >= 500)) {
        if (borg_check_light())
            return true;
    }

    /* Attempt to leave the level */
    if (borg_leave_level(true))
        return true;

    /* Search for secret doors */
    if (borg_flow_spastic(true))
        return true;

    /* Nothing */
    return false;
}